

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  bool bVar2;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  Literal *pLVar6;
  undefined4 extraout_var;
  int64_t iVar7;
  uint64_t rhs;
  uint64_t lhs;
  Address addr;
  undefined1 local_320 [8];
  array<wasm::Literal,_16UL> lanes;
  Flow ptrFlow;
  Flow vecFlow;
  MemoryInstanceInfo info;
  Literal local_e0;
  Literal local_c8;
  Literal local_b0;
  Literal local_98;
  undefined1 local_80 [8];
  Literal vec;
  anon_union_16_6_1532cd5a_for_Literal_0 local_60;
  undefined8 local_50;
  size_t local_48;
  EvallingModuleRunner *local_40;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *local_38;
  
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
            ((Flow *)&lanes._M_elems[0xf].type,
             &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
             *(Expression **)(curr + 0x30));
  if (ptrFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&ptrFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
               *(Expression **)(curr + 0x38));
    if (vecFlow.breakTo.super_IString.str._M_len == 0) {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)&vecFlow.breakTo.super_IString.str._M_str,this,
                 (Name)*(string_view *)(curr + 0x40));
      memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memory.super_IString.str._M_len = (size_t)info.instance;
      local_38 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                 vecFlow.breakTo.super_IString.str._M_str;
      local_40 = info.instance;
      local_48 = info.name.super_IString.str._M_len;
      vec.type.id = (uintptr_t)
                    getMemorySize((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                                  vecFlow.breakTo.super_IString.str._M_str,memory);
      pLVar6 = Flow::getSingleValue((Flow *)&lanes._M_elems[0xf].type);
      wasm::Literal::Literal(&local_98,pLVar6);
      uVar3 = wasm::SIMDLoadStoreLane::getMemBytes();
      if (local_98.type.id == 2) {
        iVar4 = Literal::geti32(&local_98);
        lhs = (uint64_t)iVar4;
      }
      else {
        lhs = Literal::geti64(&local_98);
      }
      rhs = vec.type.id * 0x10000;
      trapIfGt(local_38,*(uint64_t *)(curr + 0x18),rhs,"offset > memory");
      trapIfGt(local_38,lhs,rhs - *(long *)(curr + 0x18),"final > memory");
      addr.addr = lhs + *(long *)(curr + 0x18);
      trapIfGt(local_38,(ulong)uVar3,rhs,"bytes > memory");
      checkLoadAddress(local_38,addr,uVar3,(Address)vec.type.id);
      wasm::Literal::~Literal(&local_98);
      pLVar6 = Flow::getSingleValue((Flow *)&ptrFlow.breakTo.super_IString.str._M_str);
      wasm::Literal::Literal((Literal *)local_80,pLVar6);
      switch(*(undefined4 *)(curr + 0x10)) {
      case 0:
      case 4:
        wasm::Literal::getLanesUI8x16();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar5 = (*local_38->externalInterface->_vptr_ExternalInterface[0xe])
                            (local_38->externalInterface,addr.addr,local_40,local_48);
          local_60.func.super_IString.str._M_len =
               CONCAT44(local_60.i64._4_4_,iVar5) & 0xffffffff000000ff;
          local_50 = 2;
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&local_60.func);
          wasm::Literal::~Literal((Literal *)&local_60.func);
          wasm::Literal::Literal((Literal *)&info.name.super_IString.str._M_str,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
          wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
        }
        else {
          pEVar1 = local_38->externalInterface;
          iVar4 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,addr.addr,(ulong)(uint)(int)(char)iVar4,local_40,local_48);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_320);
        break;
      case 1:
      case 5:
        wasm::Literal::getLanesUI16x8();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar5 = (*local_38->externalInterface->_vptr_ExternalInterface[0x10])
                            (local_38->externalInterface,addr.addr,local_40,local_48);
          local_60.func.super_IString.str._M_len =
               CONCAT44(local_60.i64._4_4_,iVar5) & 0xffffffff0000ffff;
          local_50 = 2;
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&local_60.func);
          wasm::Literal::~Literal((Literal *)&local_60.func);
          wasm::Literal::Literal(&local_e0,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,&local_e0);
          wasm::Literal::~Literal(&local_e0);
        }
        else {
          pEVar1 = local_38->externalInterface;
          iVar4 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x17])
                    (pEVar1,addr.addr,(ulong)(uint)(int)(short)iVar4,local_40,local_48);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_320);
        break;
      case 2:
      case 6:
        wasm::Literal::getLanesI32x4();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar5 = (*local_38->externalInterface->_vptr_ExternalInterface[0x12])
                            (local_38->externalInterface,addr.addr,local_40,local_48);
          local_60.i32 = iVar5;
          local_50 = 2;
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&local_60.func);
          wasm::Literal::~Literal((Literal *)&local_60.func);
          wasm::Literal::Literal(&local_c8,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,&local_c8);
          wasm::Literal::~Literal(&local_c8);
        }
        else {
          pEVar1 = local_38->externalInterface;
          uVar3 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x18])(pEVar1,addr.addr,(ulong)uVar3,local_40,local_48);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_320);
        break;
      case 3:
      case 7:
        wasm::Literal::getLanesI64x2();
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar5 = (*local_38->externalInterface->_vptr_ExternalInterface[0x14])
                            (local_38->externalInterface,addr.addr,local_40,local_48);
          local_60.i64 = CONCAT44(extraout_var,iVar5);
          local_50 = 3;
          wasm::Literal::operator=
                    ((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type,
                     (Literal *)&local_60.func);
          wasm::Literal::~Literal((Literal *)&local_60.func);
          wasm::Literal::Literal(&local_b0,(array *)local_320);
          Flow::Flow(__return_storage_ptr__,&local_b0);
          wasm::Literal::~Literal(&local_b0);
        }
        else {
          pEVar1 = local_38->externalInterface;
          iVar7 = Literal::geti64((Literal *)&lanes._M_elems[(ulong)(byte)curr[0x28] - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x19])(pEVar1,addr.addr,iVar7,local_40,local_48);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_320);
        break;
      default:
        wasm::handle_unreachable
                  ("unexpected op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xf91);
      }
      wasm::Literal::~Literal((Literal *)local_80);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ptrFlow.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ptrFlow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&lanes._M_elems[0xf].type);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&lanes._M_elems[0xf].type);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow ptrFlow = self()->visit(curr->ptr);
    if (ptrFlow.breaking()) {
      return ptrFlow;
    }
    NOTE_EVAL1(ptrFlow);
    Flow vecFlow = self()->visit(curr->vec);
    if (vecFlow.breaking()) {
      return vecFlow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, ptrFlow.getSingleValue(), curr->getMemBytes(), memorySize);
    Literal vec = vecFlow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }